

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar-parser.cpp
# Opt level: O0

uint32_t grammar_parser::generate_symbol_id(parse_state *state,string *base_name)

{
  size_type sVar1;
  mapped_type *pmVar2;
  undefined8 in_RDI;
  uint32_t next_id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  string local_78 [4];
  uint in_stack_ffffffffffffff8c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  key_type *in_stack_ffffffffffffff98;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *in_stack_ffffffffffffffa0;
  string local_58 [32];
  string local_38 [36];
  uint32_t local_14;
  char cStack_1;
  
  cStack_1 = (char)((ulong)in_RDI >> 0x38);
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                  *)0x24f3c4);
  local_14 = (uint32_t)sVar1;
  std::operator+(in_stack_ffffffffffffff78,cStack_1);
  std::__cxx11::to_string(in_stack_ffffffffffffff8c);
  std::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  *pmVar2 = (uint32_t)sVar1;
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  return local_14;
}

Assistant:

static uint32_t generate_symbol_id(parse_state & state, const std::string & base_name) {
        uint32_t next_id = static_cast<uint32_t>(state.symbol_ids.size());
        state.symbol_ids[base_name + '_' + std::to_string(next_id)] = next_id;
        return next_id;
    }